

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::CopyTextureRegion
          (DeviceContextVkImpl *this,TextureVkImpl *pSrcTexture,
          RESOURCE_STATE_TRANSITION_MODE SrcTextureTransitionMode,TextureVkImpl *pDstTexture,
          RESOURCE_STATE_TRANSITION_MODE DstTextureTransitionMode,VkImageCopy *CopyRegion)

{
  VkImage srcImage;
  VkImage dstImage;
  VkImageCopy *CopyRegion_local;
  RESOURCE_STATE_TRANSITION_MODE DstTextureTransitionMode_local;
  TextureVkImpl *pDstTexture_local;
  RESOURCE_STATE_TRANSITION_MODE SrcTextureTransitionMode_local;
  TextureVkImpl *pSrcTexture_local;
  DeviceContextVkImpl *this_local;
  
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTextureState
            (this,pSrcTexture,SrcTextureTransitionMode,RESOURCE_STATE_COPY_SOURCE,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             "Using texture as transfer source (DeviceContextVkImpl::CopyTextureRegion)");
  TransitionOrVerifyTextureState
            (this,pDstTexture,DstTextureTransitionMode,RESOURCE_STATE_COPY_DEST,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             "Using texture as transfer destination (DeviceContextVkImpl::CopyTextureRegion)");
  srcImage = TextureVkImpl::GetVkImage(pSrcTexture);
  dstImage = TextureVkImpl::GetVkImage(pDstTexture);
  VulkanUtilities::VulkanCommandBuffer::CopyImage
            (&this->m_CommandBuffer,srcImage,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,dstImage,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,CopyRegion);
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::CopyTextureRegion(TextureVkImpl*                 pSrcTexture,
                                            RESOURCE_STATE_TRANSITION_MODE SrcTextureTransitionMode,
                                            TextureVkImpl*                 pDstTexture,
                                            RESOURCE_STATE_TRANSITION_MODE DstTextureTransitionMode,
                                            const VkImageCopy&             CopyRegion)
{
    EnsureVkCmdBuffer();
    TransitionOrVerifyTextureState(*pSrcTexture, SrcTextureTransitionMode, RESOURCE_STATE_COPY_SOURCE, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                   "Using texture as transfer source (DeviceContextVkImpl::CopyTextureRegion)");
    TransitionOrVerifyTextureState(*pDstTexture, DstTextureTransitionMode, RESOURCE_STATE_COPY_DEST, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                   "Using texture as transfer destination (DeviceContextVkImpl::CopyTextureRegion)");

    // srcImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL
    // dstImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.3)
    m_CommandBuffer.CopyImage(pSrcTexture->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, pDstTexture->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &CopyRegion);
    ++m_State.NumCommands;
}